

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitterHandle::mouseMoveEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QSplitter *this_01;
  Representation RVar2;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  QPoint QVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar10 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar11 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(byte *)(lVar1 + 0x268) & 4) != 0) {
    this_00 = *(QWidget **)(lVar1 + 0x10);
    uVar4 = QEventPoint::globalPosition();
    auVar11._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar11._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar11 = minpd(_DAT_0066f5d0,auVar11);
    auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
    auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
    uVar5 = movmskpd(uVar4,auVar10);
    uVar8 = 0x8000000000000000;
    if ((uVar5 & 1) != 0) {
      uVar8 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
    }
    uVar6 = 0x80000000;
    if ((uVar5 & 2) != 0) {
      uVar6 = (ulong)(uint)(int)auVar11._8_8_;
    }
    local_28 = (QPoint)(uVar6 | uVar8);
    QVar7 = QWidget::mapFromGlobal(this_00,&local_28);
    RVar2 = QVar7.yp.m_i;
    if (*(int *)(lVar1 + 0x260) == 1) {
      RVar2 = QVar7.xp.m_i;
    }
    iVar9 = RVar2.m_i - *(int *)(lVar1 + 0x264);
    bVar3 = QSplitter::opaqueResize
                      (*(QSplitter **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    if (bVar3) {
      moveSplitter(this,iVar9);
    }
    else {
      this_01 = *(QSplitter **)(lVar1 + 600);
      iVar9 = closestLegalPosition(this,iVar9);
      QSplitter::setRubberBand(this_01,iVar9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (!d->pressed)
        return;

    const int pos = d->pick(parentWidget()->mapFromGlobal(e->globalPosition().toPoint()))
                    - d->mouseOffset;
    if (opaqueResize()) {
        moveSplitter(pos);
    } else {
        d->s->setRubberBand(closestLegalPosition(pos));
    }
}